

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O2

PrgDisj * __thiscall
Clasp::Asp::LogicProgram::getDisjFor(LogicProgram *this,AtomSpan *head,uint32 headHash)

{
  byte *pbVar1;
  uint uVar2;
  uint *puVar3;
  size_t sVar4;
  PrgNode PVar5;
  bool bVar6;
  ulong uVar7;
  __node_type *extraout_RDX;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> _Var9;
  long lVar10;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> _Var11;
  PrgDisj *pPVar12;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>_>
  pVar13;
  uint32 headHash_local;
  PrgDisj *d;
  uint32 local_38;
  uint local_34;
  _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false> _Var8;
  
  d = (PrgDisj *)0x0;
  headHash_local = headHash;
  if (headHash != 0) {
    pVar13 = std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
             ::equal_range(&(this->index_->disj)._M_h,&headHash_local);
    _Var8 = pVar13.second.
            super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur;
    while( true ) {
      _Var9._M_cur = (__node_type *)
                     pVar13.second.
                     super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                     _M_cur;
      _Var11._M_cur =
           (__node_type *)
           pVar13.first.
           super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur;
      if ((_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>)_Var11._M_cur ==
          _Var8.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
         ) break;
      pPVar12 = (this->disjunctions_).ebo_.buf
                [*(uint *)((long)&((_Var11._M_cur)->
                                  super__Hash_node_value<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                  ).
                                  super__Hash_node_value_base<std::pair<const_unsigned_int,_unsigned_int>_>
                                  ._M_storage._M_storage + 4)];
      if (((((pPVar12->super_PrgHead).super_PrgNode.field_0x7 & 0x40) == 0) &&
          (uVar7 = (ulong)(*(uint *)&(pPVar12->super_PrgHead).field_0x18 & 0x7ffffff),
          head->size == uVar7)) &&
         (bVar6 = AtomState::allMarked<unsigned_int_const*>
                            (&this->atomState_,(uint *)&(pPVar12->super_PrgHead).field_0x1c,
                             (uint *)(&(pPVar12->super_PrgHead).field_0x1c + uVar7 * 4),'\x04'),
         _Var9._M_cur = extraout_RDX, bVar6)) goto LAB_0013b0d4;
      pVar13.second.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
      _M_cur = (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>)
               (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>)_Var9._M_cur
      ;
      pVar13.first.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
      _M_cur = (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>)
               (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>)
               ((_Var11._M_cur)->super__Hash_node_base)._M_nxt;
    }
    pPVar12 = (PrgDisj *)0x0;
LAB_0013b0d4:
    puVar3 = head->first;
    sVar4 = head->size;
    for (lVar10 = 0; sVar4 << 2 != lVar10; lVar10 = lVar10 + 4) {
      uVar2 = *(uint *)((long)puVar3 + lVar10);
      if (uVar2 < (this->atomState_).state_.ebo_.size) {
        pbVar1 = (this->atomState_).state_.ebo_.buf + uVar2;
        *pbVar1 = *pbVar1 & 0xe0;
      }
    }
    if (pPVar12 != (PrgDisj *)0x0) {
      return pPVar12;
    }
  }
  *(int *)(&this->field_0x64 + (long)this->statsId_ * 4) =
       *(int *)(&this->field_0x64 + (long)this->statsId_ * 4) + 1;
  d = PrgDisj::create((this->disjunctions_).ebo_.size,head);
  bk_lib::pod_vector<Clasp::Asp::PrgDisj_*,_std::allocator<Clasp::Asp::PrgDisj_*>_>::push_back
            (&this->disjunctions_,&d);
  PVar5 = (d->super_PrgHead).super_PrgNode;
  uVar2 = *(uint *)&(d->super_PrgHead).field_0x18;
  puVar3 = head->first;
  sVar4 = head->size;
  for (lVar10 = 0; sVar4 << 2 != lVar10; lVar10 = lVar10 + 4) {
    PrgHead::addSupport(&(this->atoms_).ebo_.buf[*(uint *)((long)puVar3 + lVar10)]->super_PrgHead,
                        (PrgEdge)(((uint)((ulong)PVar5 >> 0x1c) & 0xfffffff0) +
                                  ((int)~uVar2 >> 0x1f) * -8 + 2));
  }
  if (headHash_local != 0) {
    local_34 = *(uint *)&(d->super_PrgHead).super_PrgNode.field_0x4 & 0xfffffff;
    local_38 = headHash_local;
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
    ::_M_emplace<std::pair<unsigned_int_const,unsigned_int>>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                *)&this->index_->disj);
  }
  return d;
}

Assistant:

PrgDisj* LogicProgram::getDisjFor(const Potassco::AtomSpan& head, uint32 headHash) {
	PrgDisj* d = 0;
	if (headHash) {
		IndexRange eqRange = index_->disj.equal_range(headHash);
		for (; eqRange.first != eqRange.second; ++eqRange.first) {
			PrgDisj& o = *disjunctions_[eqRange.first->second];
			if (o.relevant() && o.size() == Potassco::size(head) && atomState_.allMarked(o.begin(), o.end(), AtomState::head_flag)) {
				assert(o.id() == eqRange.first->second);
				d = &o;
				break;
			}
		}
		for (Potassco::AtomSpan::iterator it = Potassco::begin(head), end = Potassco::end(head); it != end; ++it) {
			atomState_.clearRule(*it);
		}
	}
	if (!d) {
		// no corresponding disjunction exists, create a new object
		// and link it to all atoms
		++stats.disjunctions[statsId_];
		d = PrgDisj::create((uint32)disjunctions_.size(), head);
		disjunctions_.push_back(d);
		PrgEdge edge = PrgEdge::newEdge(*d, PrgEdge::Choice);
		for (Potassco::AtomSpan::iterator it = Potassco::begin(head), end = Potassco::end(head); it != end; ++it) {
			getAtom(*it)->addSupport(edge);
		}
		if (headHash) {
			index_->disj.insert(IndexMap::value_type(headHash, d->id()));
		}
	}
	return d;
}